

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histo.c
# Opt level: O0

int ffbinre(char **ptr,char *colname,char **exprbeg,char **exprend,double *minin,double *maxin,
           double *binsizein,char *minname,char *maxname,char *binname,int *status)

{
  size_t sVar1;
  ushort **ppuVar2;
  char *pcVar3;
  double dVar4;
  char *local_50;
  char *token;
  int isanumber;
  int slen;
  double *maxin_local;
  double *minin_local;
  char **exprend_local;
  char **exprbeg_local;
  char *colname_local;
  char **ptr_local;
  
  token._0_4_ = 0;
  local_50 = (char *)0x0;
  if (*status < 1) {
    _isanumber = maxin;
    maxin_local = minin;
    minin_local = (double *)exprend;
    exprend_local = exprbeg;
    exprbeg_local = (char **)colname;
    colname_local = (char *)ptr;
    token._4_4_ = fits_get_token2(ptr," ,=:;(",&local_50,(int *)&token,status);
    if ((*status == 0) &&
       ((token._4_4_ != 0 ||
        (((**(char **)colname_local != '\0' && (**(char **)colname_local != ',')) &&
         (**(char **)colname_local != ';')))))) {
      if (((int)token == 0) && (**(char **)colname_local != ':')) {
        if (local_50 != (char *)0x0) {
          sVar1 = strlen(local_50);
          if (0x46 < sVar1) {
            ffpmsg("column name too long (ffbinr)");
            free(local_50);
            *status = 0x1af;
            return 0x1af;
          }
          if ((*local_50 == '#') &&
             (ppuVar2 = __ctype_b_loc(), ((*ppuVar2)[(int)local_50[1]] & 0x800) != 0)) {
            strcpy((char *)exprbeg_local,local_50 + 1);
          }
          else {
            strcpy((char *)exprbeg_local,local_50);
          }
          free(local_50);
          local_50 = (char *)0x0;
        }
        while (**(char **)colname_local == ' ') {
          *(long *)colname_local = *(long *)colname_local + 1;
        }
        if (((**(char **)colname_local == '(') && (exprend_local != (char **)0x0)) &&
           (minin_local != (double *)0x0)) {
          *exprend_local = *(char **)colname_local;
          pcVar3 = fits_find_match_delim((char *)(*(long *)colname_local + 1),')');
          *minin_local = (double)pcVar3;
          if (pcVar3 == (char *)0x0) {
            ffpmsg("bin expression syntax error (ffbinr)");
            *status = 0x1af;
            return 0x1af;
          }
          *(double *)colname_local = *minin_local;
        }
        while (**(char **)colname_local == ' ') {
          *(long *)colname_local = *(long *)colname_local + 1;
        }
        if (**(char **)colname_local != '=') {
          return *status;
        }
        *(long *)colname_local = *(long *)colname_local + 1;
        while (**(char **)colname_local == ' ') {
          *(long *)colname_local = *(long *)colname_local + 1;
        }
        token._4_4_ = fits_get_token2((char **)colname_local," ,:;",&local_50,(int *)&token,status);
        if (*status != 0) {
          return *status;
        }
      }
      if (**(char **)colname_local == ':') {
        if (token._4_4_ != 0) {
          if ((int)token == 0) {
            sVar1 = strlen(local_50);
            if (0x46 < sVar1) {
              ffpmsg("minname too long (ffbinr)");
              free(local_50);
              *status = 0x1af;
              return 0x1af;
            }
            strcpy(minname,local_50);
          }
          else {
            dVar4 = strtod(local_50,(char **)0x0);
            *maxin_local = dVar4;
          }
          free(local_50);
          local_50 = (char *)0x0;
        }
        *(long *)colname_local = *(long *)colname_local + 1;
        token._4_4_ = fits_get_token2((char **)colname_local," ,:;",&local_50,(int *)&token,status);
        if (*status == 0) {
          if (token._4_4_ != 0) {
            if ((int)token == 0) {
              sVar1 = strlen(local_50);
              if (0x46 < sVar1) {
                ffpmsg("maxname too long (ffbinr)");
                free(local_50);
                *status = 0x1af;
                return 0x1af;
              }
              strcpy(maxname,local_50);
            }
            else {
              dVar4 = strtod(local_50,(char **)0x0);
              *_isanumber = dVar4;
            }
            free(local_50);
            local_50 = (char *)0x0;
          }
          if (**(char **)colname_local == ':') {
            *(long *)colname_local = *(long *)colname_local + 1;
            token._4_4_ = fits_get_token2((char **)colname_local," ,:;",&local_50,(int *)&token,
                                          status);
            if (*status == 0) {
              if (token._4_4_ != 0) {
                if ((int)token == 0) {
                  sVar1 = strlen(local_50);
                  if (0x46 < sVar1) {
                    ffpmsg("binname too long (ffbinr)");
                    free(local_50);
                    *status = 0x1af;
                    return 0x1af;
                  }
                  strcpy(binname,local_50);
                }
                else {
                  dVar4 = strtod(local_50,(char **)0x0);
                  *binsizein = dVar4;
                }
                free(local_50);
              }
              ptr_local._4_4_ = *status;
            }
            else {
              ptr_local._4_4_ = *status;
            }
          }
          else {
            free(local_50);
            ptr_local._4_4_ = *status;
          }
        }
        else {
          ptr_local._4_4_ = *status;
        }
      }
      else {
        if (local_50 != (char *)0x0) {
          if ((int)token == 0) {
            sVar1 = strlen(local_50);
            if (0x46 < sVar1) {
              ffpmsg("binname too long (ffbinr)");
              free(local_50);
              *status = 0x1af;
              return 0x1af;
            }
            strcpy(binname,local_50);
          }
          else {
            dVar4 = strtod(local_50,(char **)0x0);
            *binsizein = dVar4;
          }
          free(local_50);
        }
        ptr_local._4_4_ = *status;
      }
    }
    else {
      ptr_local._4_4_ = *status;
    }
  }
  else {
    ptr_local._4_4_ = *status;
  }
  return ptr_local._4_4_;
}

Assistant:

int ffbinre(char **ptr, 
	    char *colname, 
	    char **exprbeg, char **exprend,
	    double *minin,
	    double *maxin, 
	    double *binsizein,
	    char *minname,
	    char *maxname,
	    char *binname,
	    int *status)
/*
   Parse the input binning range specification string, returning 
   the column name, histogram min and max values, and bin size.

   This is the "extended" binning syntax that allows for an expression
   of the form XCOL(expr).  The expression must be enclosed in parentheses.

   The start and end of the expression are returned in *exprbeg and *exprend.
   If exprbeg and exprend are null pointers then the expression is forbidden.
*/
{
    int slen, isanumber=0;
    char *token=0;

    if (*status > 0)
        return(*status);

    slen = fits_get_token2(ptr, " ,=:;(", &token, &isanumber, status); /* get 1st token */

    if ((*status) || (slen == 0 && (**ptr == '\0' || **ptr == ',' || **ptr == ';')) )
        return(*status);   /* a null range string */
        
    if (!isanumber && **ptr != ':')
    {
        /* this looks like the column name */
        
        /* Check for case where col name string is empty but '='
           is still there (indicating a following specification string).
           Musn't enter this block as token would not have been allocated. */
        if (token)
        {
           if (strlen(token) > FLEN_VALUE-1)
           {
              ffpmsg("column name too long (ffbinr)");
              free(token);
              return(*status=PARSE_SYNTAX_ERR);
           }
           if (token[0] == '#' && isdigit((int) token[1]) )
           {
               /* omit the leading '#' in the column number */
               strcpy(colname, token+1);
           }
           else
               strcpy(colname, token);
           free(token);
           token=0;
        }
        while (**ptr == ' ')  /* skip over blanks */
             (*ptr)++;

	/* An optional expression of the form XCOL(expr) is allowed here, but only 
	   if exprbeg and exprend are non-null */
	if (**ptr == '(' && exprbeg && exprend) {
	  *exprbeg = *ptr;
	  if ((*exprend = fits_find_match_delim(*ptr+1,')')) == 0) { /* find ')' */
              ffpmsg("bin expression syntax error (ffbinr)");
              return(*status=PARSE_SYNTAX_ERR);
	  }
	  *ptr = *exprend; /* Advance pointer past delimeter */
	}
        while (**ptr == ' ')  (*ptr)++; /* skip over more possible blanks */
	
        if (**ptr != '=')
            return(*status);  /* reached the end */
            
        (*ptr)++;   /* skip over the = sign */

        while (**ptr == ' ')  /* skip over blanks */
             (*ptr)++;

        /* get specification info */
        slen = fits_get_token2(ptr, " ,:;", &token, &isanumber, status);
        if (*status)
           return(*status);
    }

    if (**ptr != ':')
    {
        /* This is the first token, and since it is not followed by 
         a ':' this must be the binsize token. Or it could be empty. */
        if (token)
        {
           if (!isanumber)
           {
               if (strlen(token) > FLEN_VALUE-1)
               {
                  ffpmsg("binname too long (ffbinr)");
                  free(token);
                  return(*status=PARSE_SYNTAX_ERR);
               }
               strcpy(binname, token);
           }
           else
               *binsizein =  strtod(token, NULL);

           free(token);
        }
           
        return(*status);  /* reached the end */
    }
    else
    {
        /* the token contains the min value */
        if (slen)
        {
            if (!isanumber)
            {
                if (strlen(token) > FLEN_VALUE-1)
                {
                   ffpmsg("minname too long (ffbinr)");
                   free(token);
                   return(*status=PARSE_SYNTAX_ERR);
                }
                strcpy(minname, token);
            }
            else
                *minin = strtod(token, NULL);
            free(token);
            token=0;
        }
    }

    (*ptr)++;  /* skip the colon between the min and max values */
    slen = fits_get_token2(ptr, " ,:;", &token, &isanumber, status); /* get token */
    if (*status)
       return(*status);

    /* the token contains the max value */
    if (slen)
    {
        if (!isanumber)
        {
            if (strlen(token) > FLEN_VALUE-1)
            {
               ffpmsg("maxname too long (ffbinr)");
               free(token);
               return(*status=PARSE_SYNTAX_ERR);
            }
            strcpy(maxname, token);
        }
        else
            *maxin = strtod(token, NULL);
        free(token);
        token=0;
    }

    if (**ptr != ':')
    {
        free(token);
        return(*status);  /* reached the end; no binsize token */
    }

    (*ptr)++;  /* skip the colon between the max and binsize values */
    slen = fits_get_token2(ptr, " ,:;", &token, &isanumber, status); /* get token */
    if (*status)
       return(*status);

    /* the token contains the binsize value */
    if (slen)
    {
        if (!isanumber)
        {
            if (strlen(token) > FLEN_VALUE-1)
            {
               ffpmsg("binname too long (ffbinr)");
               free(token);
               return(*status=PARSE_SYNTAX_ERR);
            }
            strcpy(binname, token);
        }
        else
            *binsizein = strtod(token, NULL);
        free(token);
    }

    return(*status);
}